

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

OffsetEntry * get_offset(File *fp,char *name,...)

{
  char in_AL;
  int iVar1;
  OffsetEntry *pOVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_1f8 [16];
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  undefined8 local_1d0;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  undefined8 local_198;
  undefined8 local_188;
  undefined8 local_178;
  undefined8 local_168;
  undefined8 local_158;
  undefined4 local_148;
  undefined4 local_144;
  va_list ap;
  char local_128 [8];
  char buf [256];
  int n;
  char *name_local;
  File *fp_local;
  
  if (in_AL != '\0') {
    local_1c8 = in_XMM0_Qa;
    local_1b8 = in_XMM1_Qa;
    local_1a8 = in_XMM2_Qa;
    local_198 = in_XMM3_Qa;
    local_188 = in_XMM4_Qa;
    local_178 = in_XMM5_Qa;
    local_168 = in_XMM6_Qa;
    local_158 = in_XMM7_Qa;
  }
  ap[0].overflow_arg_area = local_1f8;
  ap[0]._0_8_ = &stack0x00000008;
  local_144 = 0x30;
  local_148 = 0x10;
  local_1e8 = in_RDX;
  local_1e0 = in_RCX;
  local_1d8 = in_R8;
  local_1d0 = in_R9;
  iVar1 = vsnprintf(local_128,0x100,name,&local_148);
  if ((iVar1 < 0x100) && (-1 < iVar1)) {
    pOVar2 = search_for_offset(fp,local_128);
    return pOVar2;
  }
  __assert_fail("n < 256 && n >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/jplevyak[P]dparser/write_tables.c"
                ,0xd2,"OffsetEntry *get_offset(File *, char *, ...)");
}

Assistant:

static OffsetEntry *get_offset(File *fp, char *name, ...) {
  int n;
  char buf[256];
  va_list ap;
  va_start(ap, name);
  n = vsnprintf(buf, sizeof(buf), name, ap);
  (void)n;
  va_end(ap);
  assert(n < 256 && n >= 0);
  return search_for_offset(fp, buf);
}